

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O1

bool Rml::ElementUtilities::GetBoundingBox
               (Rectanglef *out_rectangle,Element *element,BoxArea box_area)

{
  Vector2f a;
  Vector2f a_00;
  long lVar1;
  code *pcVar2;
  Vector2f VVar3;
  bool bVar4;
  int i;
  Property *pPVar5;
  Box *this;
  TransformState *this_00;
  Matrix4f *rhs;
  Context *this_01;
  Vector2i VVar6;
  BoxShadow *shadow;
  long lVar7;
  int i_1;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector2f VVar11;
  Vector2f VVar12;
  float fVar13;
  Vector2f corners [4];
  Matrix4f project;
  Matrix4f project_transform;
  float local_138;
  float fStack_134;
  Vector2f local_128;
  undefined1 local_118 [48];
  Vector2f local_e8;
  Vector2f VStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  undefined1 local_b8 [16];
  MatrixAType local_a8;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  if ((element == (Element *)0x0) &&
     (bVar4 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                     ,0x104), !bVar4)) {
LAB_002354a6:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_128.x = 0.0;
  local_128.y = 0.0;
  if (box_area == Auto) {
    pPVar5 = Element::GetLocalProperty(element,BoxShadow);
    box_area = Border;
    if (pPVar5 != (Property *)0x0) {
      if (((pPVar5->value).type != BOXSHADOWLIST) &&
         (bVar4 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                         ,0x10f), !bVar4)) goto LAB_002354a6;
      lVar7 = *(long *)(pPVar5->value).data;
      lVar1 = *(long *)((pPVar5->value).data + 8);
      if (lVar7 != lVar1) {
        local_128.x = 0.0;
        local_128.y = 0.0;
        local_118._0_16_ = ZEXT816(0);
        do {
          if (*(char *)(lVar7 + 0x24) == '\0') {
            fVar8 = Element::ResolveLength(element,*(NumericValue *)(lVar7 + 0x14));
            fVar9 = Element::ResolveLength(element,*(NumericValue *)(lVar7 + 0x1c));
            fVar9 = fVar8 * 1.5 + fVar9;
            fVar8 = Element::ResolveLength(element,*(NumericValue *)(lVar7 + 4));
            fVar10 = Element::ResolveLength(element,*(NumericValue *)(lVar7 + 0xc));
            VVar11.x = fVar9 - fVar8;
            VVar11.y = fVar9 - fVar10;
            VVar11 = Math::Max<Rml::Vector2<float>>((Vector2f)local_118._0_8_,VVar11);
            local_118._8_4_ = extraout_XMM0_Dc;
            local_118._0_4_ = VVar11.x;
            local_118._4_4_ = VVar11.y;
            local_118._12_4_ = extraout_XMM0_Dd;
            VVar12.x = fVar8 + fVar9;
            VVar12.y = fVar9 + fVar10;
            VVar11 = Math::Max<Rml::Vector2<float>>(local_128,VVar12);
            local_128.x = VVar11.x;
            local_128.y = VVar11.y;
          }
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != lVar1);
        goto LAB_0023510a;
      }
    }
  }
  local_118._0_8_ = 0;
LAB_0023510a:
  VVar11 = Element::GetAbsoluteOffset(element,box_area);
  this = Element::GetBox(element);
  VVar12 = Box::GetSize(this,box_area);
  local_138 = VVar11.x;
  fStack_134 = VVar11.y;
  this_00 = Element::GetTransformState(element);
  if (this_00 == (TransformState *)0x0) {
    rhs = (MatrixBType *)0x0;
  }
  else {
    rhs = TransformState::GetTransform(this_00);
  }
  fVar8 = local_138 - (float)local_118._0_4_;
  fVar9 = fStack_134 - (float)local_118._4_4_;
  local_128.x = local_128.x + VVar12.x + local_138;
  local_128.y = local_128.y + VVar12.y + fStack_134;
  if (rhs == (MatrixBType *)0x0) {
    (out_rectangle->p0).x = fVar8;
    (out_rectangle->p0).y = fVar9;
    (out_rectangle->p1).x = local_128.x;
    (out_rectangle->p1).y = local_128.y;
    bVar4 = true;
  }
  else {
    this_01 = Element::GetContext(element);
    bVar4 = false;
    if (this_01 != (Context *)0x0) {
      local_e8.x = fVar8;
      local_e8.y = fVar9;
      VStack_e0.x = local_128.x;
      VStack_e0.y = fVar9;
      local_d8 = local_128.x;
      fStack_d4 = local_128.y;
      fStack_d0 = fVar8;
      fStack_cc = local_128.y;
      VVar6 = Context::GetDimensions(this_01);
      fVar8 = (float)VVar6.x;
      local_b8 = ZEXT416((uint)fVar8);
      local_c8 = (float)VVar6.y;
      local_a8.vectors[2].x = 0.0;
      local_a8.vectors[2].y = 0.0;
      local_a8.vectors[0].y = 0.0;
      local_a8.vectors[0].x = 2.0 / fVar8;
      local_a8.vectors[1]._0_8_ = (ulong)(uint)(2.0 / local_c8) << 0x20;
      local_a8.vectors[3].y = -local_c8 / local_c8;
      local_a8.vectors[3].x = -fVar8 / fVar8;
      local_a8.vectors[0].z = 0.0;
      local_a8.vectors[0].w = 0.0;
      local_a8.vectors[1].z = 0.0;
      local_a8.vectors[1].w = 0.0;
      local_a8.vectors[2].z = 0.0001;
      local_a8.vectors[2].w = 0.0;
      local_a8.vectors[3].z = -0.0;
      local_a8.vectors[3].w = 1.0;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(&local_a8,rhs);
      lVar7 = 0;
      do {
        fVar8 = (&local_e8)[lVar7].x;
        fVar9 = (&local_e8)[lVar7].y;
        fVar10 = fVar8 * local_5c + fVar9 * local_4c + local_3c * 0.0 + local_2c;
        fVar13 = fVar8 * local_60 + fVar9 * local_50 + local_40 * 0.0 + local_30;
        VVar3.y = ((fVar8 * local_64 + fVar9 * local_54 + local_44 * 0.0 + local_34) / fVar10 + 1.0)
                  * local_c8 * 0.5;
        VVar3.x = ((fVar8 * local_68 + fVar9 * local_58 + local_48 * 0.0 + local_38) / fVar10 + 1.0)
                  * (float)local_b8._0_4_ * 0.5;
        (&local_e8)[lVar7] = VVar3;
        bVar4 = (bool)(bVar4 | (fVar13 < -fVar10 || fVar10 < fVar13));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      if (!bVar4) {
        (out_rectangle->p0).x = local_e8.x;
        (out_rectangle->p0).y = local_e8.y;
        (out_rectangle->p1).x = local_e8.x;
        (out_rectangle->p1).y = local_e8.y;
        lVar7 = 1;
        do {
          VVar11 = (&local_e8)[lVar7];
          a.x = (out_rectangle->p0).x;
          a.y = (out_rectangle->p0).y;
          VVar12 = Math::Min<Rml::Vector2<float>>(a,VVar11);
          a_00.x = (out_rectangle->p1).x;
          a_00.y = (out_rectangle->p1).y;
          VVar11 = Math::Max<Rml::Vector2<float>>(a_00,VVar11);
          (out_rectangle->p0).x = VVar12.x;
          (out_rectangle->p0).y = VVar12.y;
          (out_rectangle->p1).x = VVar11.x;
          (out_rectangle->p1).y = VVar11.y;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
  }
  return bVar4;
}

Assistant:

bool ElementUtilities::GetBoundingBox(Rectanglef& out_rectangle, Element* element, BoxArea box_area)
{
	RMLUI_ASSERT(element);

	Vector2f shadow_extent_top_left, shadow_extent_bottom_right;
	if (box_area == BoxArea::Auto)
	{
		// 'Auto' acts like border box extended to encompass any ink overflow, including the element's box-shadow.
		// Note: Does not currently include ink overflow due to filters, as that is handled manually in ElementEffects.
		box_area = BoxArea::Border;

		if (const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow))
		{
			RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
			const BoxShadowList& shadow_list = p_box_shadow->value.GetReference<BoxShadowList>();

			for (const BoxShadow& shadow : shadow_list)
			{
				if (!shadow.inset)
				{
					const float extent = 1.5f * element->ResolveLength(shadow.blur_radius) + element->ResolveLength(shadow.spread_distance);
					const Vector2f offset = {element->ResolveLength(shadow.offset_x), element->ResolveLength(shadow.offset_y)};

					shadow_extent_top_left = Math::Max(shadow_extent_top_left, -offset + Vector2f(extent));
					shadow_extent_bottom_right = Math::Max(shadow_extent_bottom_right, offset + Vector2f(extent));
				}
			}
		}
	}

	// Element bounds in non-transformed space.
	Rectanglef bounds = Rectanglef::FromPositionSize(element->GetAbsoluteOffset(box_area), element->GetBox().GetSize(box_area));
	bounds = bounds.Extend(shadow_extent_top_left, shadow_extent_bottom_right);

	const TransformState* transform_state = element->GetTransformState();
	const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);

	// Early exit in the common case of no transform.
	if (!transform)
	{
		out_rectangle = bounds;
		return true;
	}

	Context* context = element->GetContext();
	if (!context)
		return false;

	constexpr int num_corners = 4;
	Vector2f corners[num_corners] = {
		bounds.TopLeft(),
		bounds.TopRight(),
		bounds.BottomRight(),
		bounds.BottomLeft(),
	};

	// Transform and project corners to window coordinates.
	constexpr float z_clip = 10'000.f;
	const Vector2f window_size = Vector2f(context->GetDimensions());
	const Matrix4f project = Matrix4f::ProjectOrtho(0.f, window_size.x, 0.f, window_size.y, -z_clip, z_clip);
	const Matrix4f project_transform = project * (*transform);
	bool any_vertex_depth_clipped = false;

	for (int i = 0; i < num_corners; i++)
	{
		const Vector4f pos_clip_space = project_transform * Vector4f(corners[i].x, corners[i].y, 0, 1);
		const Vector2f pos_ndc = Vector2f(pos_clip_space.x, pos_clip_space.y) / pos_clip_space.w;
		const Vector2f pos_viewport = 0.5f * window_size * (pos_ndc + Vector2f(1));
		corners[i] = pos_viewport;
		any_vertex_depth_clipped |= !(-pos_clip_space.w <= pos_clip_space.z && pos_clip_space.z <= pos_clip_space.w);
	}

	// If any part of the box area is outside the depth clip planes we give up finding the bounding box. In this situation a renderer would normally
	// clip the underlying triangles against the clip planes. We could in principle do the same, but the added complexity does not seem worthwhile for
	// our use cases.
	if (any_vertex_depth_clipped)
		return false;

	// Find the rectangle covering the projected corners.
	out_rectangle = Rectanglef::FromPosition(corners[0]);
	for (int i = 1; i < num_corners; i++)
		out_rectangle = out_rectangle.Join(corners[i]);

	return true;
}